

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O2

void __thiscall ccs::Value::str(Value *this)

{
  ostream *this_00;
  runtime_error *this_01;
  char *pcVar1;
  string local_1b0;
  ostringstream msg;
  
  switch(this->which_) {
  case String:
    StringVal::str_abi_cxx11_(&local_1b0,&this->rawStringVal_);
    goto LAB_00144cdb;
  case Int:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    std::ostream::_M_insert<long>((long)&msg);
    std::__cxx11::stringbuf::str();
    break;
  case Double:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    std::ostream::_M_insert<double>((this->rawPrimVal_).doubleVal);
    std::__cxx11::stringbuf::str();
    break;
  case Bool:
    pcVar1 = "false";
    if ((this->rawPrimVal_).boolVal != false) {
      pcVar1 = "true";
    }
    std::__cxx11::string::string((string *)&local_1b0,pcVar1,(allocator *)&msg);
    goto LAB_00144cdb;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    this_00 = std::operator<<((ostream *)&msg,"Bad enum value ");
    std::ostream::operator<<((ostream *)this_00,this->which_);
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_01,(string *)&local_1b0);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_00144cdb:
  std::__cxx11::string::operator=((string *)&this->strVal_,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void Value::str()
  { strVal_ = accept<std::string>(ToString()); }